

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::SetMotorVoltage(AmpIO *this,uint index,double volts)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t bits;
  double Volts2BitsQLA;
  double volts_local;
  uint index_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x64524131) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (ulong)((volts + 45.5) * 720.1648351648352 + 0.5);
    if ((uVar2 & 0xffff0000) == 0) {
      this_local._7_1_ = SetMotorVoltage(this,index,(uint32_t)uVar2);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::SetMotorVoltage(unsigned int index, double volts)
{
    if (GetHardwareVersion() == dRA1_String)
        return false;

    const double Volts2BitsQLA = 65535/91.0;   // 91.0 = 36.4*2.5
    uint32_t bits = static_cast<uint32_t>((volts+45.5)*Volts2BitsQLA+0.5);
    if (bits&0xffff0000)
        return false;    // volts too high or low (could instead truncate)
    return SetMotorVoltage(index, bits);
}